

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O1

void Ptex::v2_2::(anonymous_namespace)::Apply<Ptex::v2_2::PtexHalf,3>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  ushort *puVar1;
  ushort *puVar2;
  float fVar3;
  byte bVar4;
  int iVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  ushort *puVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  bVar4 = (k->res).ulog2;
  iVar10 = 3 << (bVar4 & 0x1f);
  if (k->vw != 0) {
    puVar9 = (ushort *)((long)data + ((long)(k->v << (bVar4 & 0x1f)) + (long)k->u) * 6);
    puVar2 = puVar9 + k->vw * iVar10;
    pfVar8 = k->kv;
    iVar5 = k->uw;
    pfVar6 = k->ku;
    do {
      fVar12 = *pfVar6;
      fVar13 = *(float *)(PtexHalf::h2fTable + (ulong)*puVar9 * 4) * fVar12;
      fVar14 = *(float *)(PtexHalf::h2fTable + (ulong)puVar9[1] * 4) * fVar12;
      fVar12 = fVar12 * *(float *)(PtexHalf::h2fTable + (ulong)puVar9[2] * 4);
      lVar11 = (long)(iVar5 * 3) * 2 + -6;
      pfVar7 = pfVar6;
      if (iVar5 != 1) {
        do {
          puVar1 = puVar9 + 3;
          fVar3 = pfVar7[1];
          fVar13 = fVar13 + fVar3 * *(float *)(PtexHalf::h2fTable + (ulong)puVar9[3] * 4);
          fVar14 = fVar14 + fVar3 * *(float *)(PtexHalf::h2fTable + (ulong)puVar9[4] * 4);
          fVar12 = fVar12 + fVar3 * *(float *)(PtexHalf::h2fTable + (ulong)puVar9[5] * 4);
          lVar11 = lVar11 + -6;
          puVar9 = puVar1;
          pfVar7 = pfVar7 + 1;
        } while (lVar11 != 0);
      }
      fVar3 = *pfVar8;
      *(ulong *)result =
           CONCAT44(fVar3 * fVar14 + (float)((ulong)*(undefined8 *)result >> 0x20),
                    fVar3 * fVar13 + (float)*(undefined8 *)result);
      pfVar8 = pfVar8 + 1;
      result[2] = fVar12 * fVar3 + result[2];
      puVar9 = puVar9 + (long)(iVar10 + iVar5 * -3) + 3;
    } while (puVar9 != puVar2);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }